

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::atou<unsigned_long>(c4 *this,csubstr str,unsigned_long *v)

{
  code *pcVar1;
  undefined1 uVar2;
  c4 cVar3;
  size_t sVar4;
  byte bVar5;
  ulong *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  basic_substring<const_char> local_28;
  
  puVar6 = (ulong *)str.len;
  pcVar8 = str.str;
  if (pcVar8 != (char *)0x0) {
    if (this == (c4 *)0x0) {
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar1 = (code *)swi(3);
        uVar2 = (*pcVar1)();
        return (bool)uVar2;
      }
      handle_error(0x250c0a,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c6,"len > 0 && str != nullptr");
    }
    if (*this == (c4)0x30) {
      if (pcVar8 == (char *)0x1) {
        bVar11 = true;
        uVar9 = 0;
LAB_0023c84c:
        *puVar6 = uVar9;
        return bVar11;
      }
      bVar5 = (byte)this[1] & 0xdf;
      if (bVar5 == 0x42) {
        if (pcVar8 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_28,(char *)(this + 2),(size_t)(pcVar8 + -2));
          if ((local_28.len == 0) || ((byte *)local_28.str == (byte *)0x0)) {
            if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              pcVar1 = (code *)swi(3);
              uVar2 = (*pcVar1)();
              return (bool)uVar2;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x2cce,"!s.empty()");
          }
          *puVar6 = 0;
          bVar11 = local_28.len == 0;
          if (bVar11) {
            return bVar11;
          }
          uVar9 = *puVar6;
          sVar4 = 0;
          do {
            uVar9 = uVar9 * 2;
            if (local_28.str[sVar4] != 0x30) {
              if (local_28.str[sVar4] != 0x31) break;
              uVar9 = uVar9 | 1;
            }
            sVar4 = sVar4 + 1;
            bVar11 = local_28.len == sVar4;
          } while (!bVar11);
          goto LAB_0023c84c;
        }
      }
      else if (bVar5 == 0x4f) {
        if (pcVar8 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_28,(char *)(this + 2),(size_t)(pcVar8 + -2));
          if ((local_28.len == 0) || ((byte *)local_28.str == (byte *)0x0)) {
            if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              pcVar1 = (code *)swi(3);
              uVar2 = (*pcVar1)();
              return (bool)uVar2;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x2ceb,"!s.empty()");
          }
          *puVar6 = 0;
          bVar11 = local_28.len == 0;
          if (bVar11) {
            return bVar11;
          }
          bVar5 = *local_28.str;
          if ((bVar5 & 0xf8) != 0x30) {
            return bVar11;
          }
          uVar9 = *puVar6;
          sVar4 = 1;
          do {
            uVar9 = ((ulong)bVar5 + uVar9 * 8) - 0x30;
            bVar11 = local_28.len == sVar4;
            if (bVar11) break;
            bVar5 = local_28.str[sVar4];
            sVar4 = sVar4 + 1;
          } while ((bVar5 & 0xf8) == 0x30);
          goto LAB_0023c84c;
        }
      }
      else if (bVar5 == 0x58) {
        if (pcVar8 != (char *)0x2) {
          basic_substring<const_char>::basic_substring
                    (&local_28,(char *)(this + 2),(size_t)(pcVar8 + -2));
          if ((local_28.len != 0) && ((byte *)local_28.str != (byte *)0x0)) {
            *puVar6 = 0;
            bVar11 = local_28.len == 0;
            if (bVar11) {
              return bVar11;
            }
            sVar4 = 0;
            while( true ) {
              bVar5 = local_28.str[sVar4];
              lVar10 = -0x30;
              if (((9 < (byte)(bVar5 - 0x30)) && (lVar10 = -0x57, 5 < (byte)(bVar5 + 0x9f))) &&
                 (lVar10 = -0x37, 5 < (byte)(bVar5 + 0xbf))) break;
              *puVar6 = *puVar6 * 0x10 + lVar10 + (ulong)bVar5;
              sVar4 = sVar4 + 1;
              bVar11 = local_28.len == sVar4;
              if (bVar11) {
                return bVar11;
              }
            }
            return bVar11;
          }
          if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            pcVar1 = (code *)swi(3);
            uVar2 = (*pcVar1)();
            return (bool)uVar2;
          }
          handle_error(0x250c0a,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2cac,"!s.empty()");
        }
      }
      else {
        *puVar6 = 0;
        cVar3 = *this;
        if ((byte)((char)cVar3 - 0x30U) < 10) {
          uVar9 = *puVar6;
          pcVar7 = (char *)0x1;
          do {
            uVar9 = ((ulong)(byte)cVar3 + uVar9 * 10) - 0x30;
            bVar11 = pcVar8 == pcVar7;
            if (bVar11) break;
            cVar3 = this[(long)pcVar7];
            pcVar7 = pcVar7 + 1;
          } while ((byte)((char)cVar3 - 0x30U) < 10);
          goto LAB_0023c83a;
        }
      }
    }
    else if (*this != (c4)0x2d) {
      *puVar6 = 0;
      cVar3 = *this;
      if ((byte)((char)cVar3 - 0x30U) < 10) {
        uVar9 = *puVar6;
        pcVar7 = (char *)0x1;
        do {
          uVar9 = ((ulong)(byte)cVar3 + uVar9 * 10) - 0x30;
          bVar11 = pcVar8 == pcVar7;
          if (bVar11) break;
          cVar3 = this[(long)pcVar7];
          pcVar7 = pcVar7 + 1;
        } while ((byte)((char)cVar3 - 0x30U) < 10);
LAB_0023c83a:
        *puVar6 = uVar9;
        return bVar11;
      }
    }
  }
  return false;
}

Assistant:

bool atou(csubstr str, T * C4_RESTRICT v) noexcept
{
    C4_STATIC_ASSERT(std::is_integral<T>::value);

    if(C4_UNLIKELY(str.len == 0 || str.front() == '-'))
        return false;

    bool parsed_ok = true;
    if(str.str[0] != '0')
    {
        parsed_ok = read_dec(str, v);
    }
    else
    {
        if(str.len > 1)
        {
            const char pfx = str.str[1];
            if(pfx == 'x' || pfx == 'X')
                parsed_ok = str.len > 2 && read_hex(str.sub(2), v);
            else if(pfx == 'b' || pfx == 'B')
                parsed_ok = str.len > 2 && read_bin(str.sub(2), v);
            else if(pfx == 'o' || pfx == 'O')
                parsed_ok = str.len > 2 && read_oct(str.sub(2), v);
            else
                parsed_ok = read_dec(str, v);
        }
        else
        {
            *v = 0; // we know the first character is 0
        }
    }
    return parsed_ok;
}